

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O1

bool __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,FILE *stream,
          vector<char,_std::allocator<char>_> *input_vector,
          function<void_(unsigned_long)> *progress_callback)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  char *extraout_RDX;
  long lVar8;
  pointer output_end;
  EncodingConversion *pEVar9;
  u16string *this_00;
  ulong uVar10;
  size_type __n;
  long lVar11;
  pointer pcVar12;
  float fVar13;
  pointer pcStack_b0;
  char *pcStack_a8;
  uint uStack_9c;
  EncodingConversion *pEStack_98;
  char *pcStack_90;
  long lStack_88;
  ulong uStack_80;
  size_t sStack_78;
  vector<char,_std::allocator<char>_> *pvStack_70;
  long lStack_68;
  code *pcStack_60;
  FILE *local_58;
  EncodingConversion *local_50;
  u16string *local_48;
  EncodingConversion *local_40;
  long local_38;
  
  pcVar1 = *(char **)input_vector;
  lVar8 = 0;
  lVar11 = 0;
  local_58 = (FILE *)stream;
  local_50 = this;
  local_48 = string;
  local_40 = (EncodingConversion *)progress_callback;
  do {
    uVar10 = *(long *)(input_vector + 8) - (*(long *)input_vector + lVar11);
    pcStack_60 = (code *)0x1634aa;
    sVar4 = fread(pcVar1 + lVar11,1,uVar10,local_58);
    if (sVar4 < uVar10) {
      pcStack_60 = (code *)0x1634bb;
      iVar3 = ferror(local_58);
      iVar7 = 1;
      if (iVar3 == 0) goto LAB_001634c4;
    }
    else {
LAB_001634c4:
      uVar10 = sVar4 + lVar11;
      if (uVar10 == 0) {
        iVar7 = 2;
      }
      else {
        uStack_9c = (uint)(sVar4 == 0);
        pcStack_60 = (code *)0x1634eb;
        uVar6 = uVar10;
        this_00 = local_48;
        sVar5 = decode(local_50,local_48,pcVar1,uVar10,sVar4 == 0);
        lVar8 = lVar8 + sVar5;
        local_38 = lVar8;
        if (local_40[1].data == (void *)0x0) {
          pcStack_60 = decode;
          pEVar9 = local_40;
          std::__throw_bad_function_call();
          __n = this_00->_M_string_length;
          pEStack_98 = pEVar9;
          lStack_88 = lVar8;
          uStack_80 = uVar10;
          sStack_78 = sVar4;
          pvStack_70 = input_vector;
          lStack_68 = lVar11;
          pcStack_60 = (code *)pcVar1;
          std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::resize
                    (this_00,uVar6 + __n,L'\0');
          pcVar1 = extraout_RDX + uVar6;
          pcVar12 = (this_00->_M_dataplus)._M_p;
          pcStack_b0 = pcVar12 + __n;
          pcStack_a8 = extraout_RDX;
          pcStack_90 = extraout_RDX;
          if (pcVar1 <= extraout_RDX) goto LAB_001636b2;
          output_end = pcStack_b0 + uVar6;
          bVar2 = false;
          pEVar9 = pEStack_98;
          break;
        }
        pcStack_60 = (code *)0x16350a;
        (**(code **)&local_40[1].mode)(local_40,&local_38);
        lVar11 = uVar10 - sVar5;
        if (sVar5 <= uVar10 && lVar11 != 0) {
          pcStack_60 = (code *)0x163526;
          memmove(pcVar1,pcVar1 + sVar5,uVar10 - sVar5);
        }
        iVar7 = 0;
      }
    }
    if (iVar7 != 0) {
      return iVar7 == 2;
    }
  } while( true );
LAB_001635bd:
  iVar3 = convert(pEVar9,&pcStack_a8,pcVar1,(char **)&pcStack_b0,(char *)output_end);
  __n = ((long)pcStack_b0 - (long)pcVar12) / 2;
  if (iVar3 == 1) {
    uVar10 = this_00->_M_string_length;
    fVar13 = (float)uVar10;
    fVar13 = fVar13 + fVar13;
    uVar6 = (ulong)fVar13;
    uVar6 = (long)(fVar13 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    resize(this_00,uVar6,L'\0');
    pcVar12 = (this_00->_M_dataplus)._M_p;
    pcStack_b0 = (pointer)(uVar10 + (long)pcVar12);
    output_end = (pointer)(uVar6 + (long)pcVar12);
    pEVar9 = pEStack_98;
  }
  else if (iVar3 == 2) {
LAB_0016360b:
    pcStack_a8 = pcStack_a8 + 1;
    (this_00->_M_dataplus)._M_p[__n] = L'�';
    pcStack_b0 = pcStack_b0 + 1;
    __n = __n + 1;
  }
  else if (iVar3 == 3) {
    if ((char)uStack_9c != '\0') goto LAB_0016360b;
    bVar2 = true;
  }
  if ((pcVar1 <= pcStack_a8) || (bVar2)) {
LAB_001636b2:
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    resize(this_00,__n,L'\0');
    return (bool)((char)pcStack_a8 - (char)pcStack_90);
  }
  goto LAB_001635bd;
}

Assistant:

bool EncodingConversion::decode(u16string &string, FILE *stream,
                                vector<char> &input_vector,
                                function<void(size_t)> progress_callback) {
  char *input_buffer = input_vector.data();
  size_t bytes_left_over = 0;
  size_t total_bytes_read = 0;

  for (;;) {
    size_t bytes_to_read = input_vector.size() - bytes_left_over;
    size_t bytes_read = fread(input_buffer + bytes_left_over, 1, bytes_to_read, stream);
    if (bytes_read < bytes_to_read && ferror(stream)) return false;
    size_t bytes_to_append = bytes_left_over + bytes_read;
    if (bytes_to_append == 0) break;

    size_t bytes_appended = decode(
      string,
      input_buffer,
      bytes_to_append,
      bytes_read == 0
    );

    total_bytes_read += bytes_appended;
    progress_callback(total_bytes_read);

    if (bytes_appended < bytes_to_append) {
      std::copy(input_buffer + bytes_appended, input_buffer + bytes_to_append, input_buffer);
    }

    bytes_left_over = bytes_to_append - bytes_appended;
  }

  return true;
}